

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupAndConesLimit2(Gia_Man_t *p,int *pAnds,int nAnds,int Level)

{
  Gia_Man_t *p_00;
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  int local_2c;
  int i;
  Gia_Man_t *pNew;
  int Level_local;
  int nAnds_local;
  int *pAnds_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManStart(1000);
  pcVar1 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar1;
  Gia_ManFillValue(p);
  pGVar2 = Gia_ManConst0(p);
  pGVar2->Value = 0;
  for (local_2c = 0; local_2c < nAnds; local_2c = local_2c + 1) {
    Gia_ManDupAndConesLimit2_rec(p_00,p,pAnds[local_2c],Level);
  }
  for (local_2c = 0; local_2c < nAnds; local_2c = local_2c + 1) {
    pGVar2 = Gia_ManObj(p,pAnds[local_2c]);
    Gia_ManAppendCo(p_00,pGVar2->Value);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupAndConesLimit2( Gia_Man_t * p, int * pAnds, int nAnds, int Level )
{
    Gia_Man_t * pNew;
    int i;
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nAnds; i++ )
        Gia_ManDupAndConesLimit2_rec( pNew, p, pAnds[i], Level );
    for ( i = 0; i < nAnds; i++ )
        Gia_ManAppendCo( pNew, Gia_ManObj(p, pAnds[i])->Value );
    return pNew;

}